

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader *
capnp::_::WireHelpers::readListPointer
          (ListReader *__return_storage_ptr__,SegmentReader *segment,CapTableReader *capTable,
          WirePointer *ref,word *refTarget,word *defaultValue,ElementSize expectedElementSize,
          int nestingLimit,bool checkElementSize)

{
  undefined4 elementCount_00;
  word *this;
  word *ptr_00;
  WirePointer *capTable_00;
  CapTableReader *segment_00;
  bool bVar1;
  ElementSize EVar2;
  unsigned_short uVar3;
  unsigned_short structPointerCount;
  BitsPerElementN<23> step_00;
  ElementCountN<29> i;
  uint step_01;
  unsigned_long uVar4;
  WordCount64 WVar5;
  Fault local_2b8;
  Fault f_13;
  undefined1 local_2a8 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition_11;
  Fault f_12;
  undefined1 local_270 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition_10;
  WirePointerCount expectedPointersPerElement;
  BitCount expectedDataBitsPerElement;
  Fault f_11;
  Fault f_10;
  DebugExpression<bool> _kjCondition_9;
  Fault f_9;
  DebugExpression<bool> _kjCondition_8;
  WordCount64 wordCount_1;
  uint step;
  ElementCountN<29> elementCount;
  uint pointerCount;
  uint dataSize;
  Fault f_8;
  undefined1 local_1f0 [8];
  DebugComparison<unsigned_short,_unsigned_int> _kjCondition_7;
  Fault f_7;
  undefined1 local_1c0 [8];
  DebugComparison<unsigned_short,_unsigned_int> _kjCondition_6;
  Fault f_6;
  Fault f_5;
  DebugExpression<bool> _kjCondition_5;
  Fault f_4;
  DebugExpression<unsigned_long> local_178;
  undefined1 local_170 [8];
  DebugComparison<unsigned_long,_unsigned_int_&> _kjCondition_4;
  uint wordsPerElement;
  ListElementCount size;
  Fault f_3;
  Kind local_130;
  DebugExpression<capnp::_::WirePointer::Kind> local_12c;
  undefined1 local_128 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_3;
  Fault f_2;
  DebugExpression<bool> _kjCondition_2;
  WirePointer *tag;
  WordCountN<29> wordCount;
  ElementSize elementSize;
  Fault f_1;
  Kind local_d8;
  DebugExpression<capnp::_::WirePointer::Kind> local_d4;
  undefined1 local_d0 [8];
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition_1;
  word *p;
  word *local_a0;
  word *_p2283;
  word *ptr;
  Fault local_80;
  Fault f;
  int *local_70;
  undefined1 local_68 [8];
  DebugComparison<int_&,_int> _kjCondition;
  WirePointer *pWStack_38;
  bool checkElementSize_local;
  word *defaultValue_local;
  word *refTarget_local;
  WirePointer *ref_local;
  CapTableReader *capTable_local;
  SegmentReader *segment_local;
  
  _kjCondition._39_1_ = checkElementSize;
  refTarget_local = (word *)ref;
  ref_local = (WirePointer *)capTable;
  capTable_local = (CapTableReader *)segment;
  bVar1 = WirePointer::isNull(ref);
  pWStack_38 = (WirePointer *)defaultValue;
  defaultValue_local = refTarget;
  if (bVar1) goto LAB_00365aee;
  do {
    local_70 = (int *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&nestingLimit);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<int&>::operator>
              ((DebugComparison<int_&,_int> *)local_68,(DebugExpression<int&> *)&local_70,
               (int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,(DebugComparison<int_&,_int> *)local_68,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&local_80);
      goto LAB_00365aee;
    }
    followFars((WireHelpers *)&p,(WirePointer **)&refTarget_local,defaultValue_local,
               (SegmentReader **)&capTable_local);
    local_a0 = kj::_::readMaybe<capnp::word_const>((Maybe<const_capnp::word_&> *)&p);
    if (local_a0 == (word *)0x0) goto LAB_00365aee;
    _kjCondition_1._24_8_ = local_a0;
    _p2283 = local_a0;
    local_d8 = WirePointer::kind((WirePointer *)refTarget_local);
    local_d4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d8);
    f_1.exception._4_4_ = 1;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)local_d0
               ,&local_d4,(Kind *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                ((Fault *)&wordCount,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  local_d0,
                 (char (*) [84])
                 "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&wordCount);
      goto LAB_00365aee;
    }
    tag._7_1_ = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
    if (tag._7_1_ != INLINE_COMPOSITE) {
      EVar2 = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      elementCount = dataBitsPerElement(EVar2);
      EVar2 = WirePointer::ListRef::elementSize((ListRef *)((long)&refTarget_local->content + 4));
      step = pointersPerElement(EVar2);
      i = WirePointer::ListRef::elementCount((ListRef *)((long)&refTarget_local->content + 4));
      step_01 = elementCount + step * 0x40;
      uVar4 = upgradeBound<unsigned_long,unsigned_int>(i);
      WVar5 = roundBitsUpToWords(uVar4 * step_01);
      f_9.exception._6_1_ =
           boundsCheck((SegmentReader *)capTable_local,_p2283,(WordCountN<31>)WVar5);
      f_9.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (bool *)((long)&f_9.exception + 6));
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f_9.exception + 7));
      if (bVar1) {
        if (tag._7_1_ == VOID) {
          f_10.exception._6_1_ = amplifiedRead((SegmentReader *)capTable_local,i);
          f_10.exception._7_1_ =
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&f_10.exception + 6));
          bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                            ((DebugExpression *)((long)&f_10.exception + 7));
          if (!bVar1) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                      (&f_11,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x960,FAILED,
                       "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))",
                       "_kjCondition,\"Message contains amplified list pointer.\"",
                       (DebugExpression<bool> *)((long)&f_10.exception + 7),
                       (char (*) [41])"Message contains amplified list pointer.");
            kj::_::Debug::Fault::~Fault(&f_11);
            goto LAB_00365aee;
          }
        }
        if ((_kjCondition._39_1_ & 1) == 0) {
LAB_00366649:
          ListReader::ListReader
                    (__return_storage_ptr__,(SegmentReader *)capTable_local,
                     (CapTableReader *)ref_local,_p2283,i,step_01,elementCount,
                     (StructPointerCount)step,tag._7_1_,nestingLimit + -1);
          return __return_storage_ptr__;
        }
        if ((tag._7_1_ == BIT) && (expectedElementSize != BIT)) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    ((Fault *)&expectedPointersPerElement,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x969,FAILED,(char *)0x0,
                     "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                     ,(char (*) [106])0x49bbba);
          kj::_::Debug::Fault::~Fault((Fault *)&expectedPointersPerElement);
        }
        else {
          _kjCondition_10._36_4_ = dataBitsPerElement(expectedElementSize);
          _kjCondition_10._32_4_ = pointersPerElement(expectedElementSize);
          f_12.exception =
               (Exception *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (uint *)&_kjCondition_10.field_0x24);
          kj::_::DebugExpression<unsigned_int&>::operator<=
                    ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_270,
                     (DebugExpression<unsigned_int&> *)&f_12,&elementCount);
          bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_270);
          if (bVar1) {
            f_13.exception =
                 (Exception *)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (uint *)&_kjCondition_10.result);
            kj::_::DebugExpression<unsigned_int&>::operator<=
                      ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_2a8,
                       (DebugExpression<unsigned_int&> *)&f_13,&step);
            bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a8);
            if (bVar1) goto LAB_00366649;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                      (&local_2b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x97d,FAILED,"expectedPointersPerElement <= pointerCount",
                       "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_2a8,
                       (char (*) [72])
                       "Schema mismatch: Message contained list with incompatible element type.");
            kj::_::Debug::Fault::~Fault(&local_2b8);
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                      ((Fault *)&_kjCondition_11.result,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x979,FAILED,"expectedDataBitsPerElement <= dataSize",
                       "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                       ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_270,
                       (char (*) [72])
                       "Schema mismatch: Message contained list with incompatible element type.");
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_11.result);
          }
        }
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                  ((Fault *)&stack0xfffffffffffffdd8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x958,FAILED,"boundsCheck(segment, ptr, wordCount)",
                   "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)((long)&f_9.exception + 7),
                   (char (*) [319])
                   "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffdd8);
      }
      goto LAB_00365aee;
    }
    tag._0_4_ = WirePointer::ListRef::inlineCompositeWordCount
                          ((ListRef *)((long)&refTarget_local->content + 4));
    this = _p2283;
    f_2.exception._6_1_ =
         boundsCheck((SegmentReader *)capTable_local,_p2283,(WordCountN<29>)tag + 1);
    f_2.exception._7_1_ =
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_2.exception + 6))
    ;
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                      ((DebugExpression *)((long)&f_2.exception + 7));
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                ((Fault *)&_kjCondition_3.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x900,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                 "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)((long)&f_2.exception + 7),
                 (char (*) [319])
                 "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3.result);
      goto LAB_00365aee;
    }
    _p2283 = _p2283 + 1;
    local_130 = WirePointer::kind((WirePointer *)this);
    local_12c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_130);
    f_3.exception._4_4_ = 0;
    kj::_::DebugExpression<capnp::_::WirePointer::Kind>::operator==
              ((DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
               local_128,&local_12c,(Kind *)((long)&f_3.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                ((Fault *)&wordsPerElement,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\"",
                 (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                 local_128,
                 (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
      kj::_::Debug::Fault::~Fault((Fault *)&wordsPerElement);
      goto LAB_00365aee;
    }
    _kjCondition_4._36_4_ = WirePointer::inlineCompositeListElementCount((WirePointer *)this);
    _kjCondition_4._32_4_ =
         WirePointer::StructRef::wordSize((StructRef *)((long)&this->content + 4));
    uVar4 = upgradeBound<unsigned_long,unsigned_int>(_kjCondition_4._36_4_);
    f_4.exception = (Exception *)(uVar4 * (uint)_kjCondition_4._32_4_);
    local_178 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&f_4);
    kj::_::DebugExpression<unsigned_long>::operator<=
              ((DebugComparison<unsigned_long,_unsigned_int_&> *)local_170,&local_178,(uint *)&tag);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                ((Fault *)&stack0xfffffffffffffe78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                 "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                 (DebugComparison<unsigned_long,_unsigned_int_&> *)local_170,
                 (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffe78);
      goto LAB_00365aee;
    }
    if (_kjCondition_4._32_4_ == 0) {
      f_5.exception._6_1_ = amplifiedRead((SegmentReader *)capTable_local,_kjCondition_4._36_4_);
      f_5.exception._7_1_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (bool *)((long)&f_5.exception + 6));
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                        ((DebugExpression *)((long)&f_5.exception + 7));
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                  (&f_6,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x917,FAILED,"amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))",
                   "_kjCondition,\"Message contains amplified list pointer.\"",
                   (DebugExpression<bool> *)((long)&f_5.exception + 7),
                   (char (*) [41])"Message contains amplified list pointer.");
        kj::_::Debug::Fault::~Fault(&f_6);
        goto LAB_00365aee;
      }
    }
    if ((_kjCondition._39_1_ & 1) == 0) goto switchD_00366030_default;
    switch(expectedElementSize) {
    case VOID:
    default:
switchD_00366030_default:
      segment_00 = capTable_local;
      capTable_00 = ref_local;
      ptr_00 = _p2283;
      elementCount_00 = _kjCondition_4._36_4_;
      step_00 = _kjCondition_4._32_4_ << 6;
      uVar3 = DirectWireValue<unsigned_short>::get
                        ((DirectWireValue<unsigned_short> *)((long)&this->content + 4));
      structPointerCount =
           DirectWireValue<unsigned_short>::get
                     ((DirectWireValue<unsigned_short> *)((long)&this->content + 6));
      ListReader::ListReader
                (__return_storage_ptr__,(SegmentReader *)segment_00,(CapTableReader *)capTable_00,
                 ptr_00,elementCount_00,step_00,(uint)uVar3 << 6,structPointerCount,INLINE_COMPOSITE
                 ,nestingLimit + -1);
      return __return_storage_ptr__;
    case BIT:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                ((Fault *)&_kjCondition_6.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x92a,FAILED,(char *)0x0,
                 "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                 ,(char (*) [106])0x49b708);
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_6.result);
      break;
    case BYTE:
    case TWO_BYTES:
    case FOUR_BYTES:
    case EIGHT_BYTES:
      f_7.exception._4_2_ =
           DirectWireValue<unsigned_short>::get
                     ((DirectWireValue<unsigned_short> *)((long)&this->content + 4));
      f_7.exception._6_2_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (unsigned_short *)((long)&f_7.exception + 4));
      f_7.exception._0_4_ = 0;
      kj::_::DebugExpression<unsigned_short>::operator>
                ((DebugComparison<unsigned_short,_unsigned_int> *)local_1c0,
                 (DebugExpression<unsigned_short> *)((long)&f_7.exception + 6),(uint *)&f_7);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
      if (bVar1) goto switchD_00366030_default;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                ((Fault *)&_kjCondition_7.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                 "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                 ,(DebugComparison<unsigned_short,_unsigned_int> *)local_1c0,
                 (char (*) [84])
                 "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                );
      kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_7.result);
      break;
    case POINTER:
      f_8.exception._4_2_ =
           DirectWireValue<unsigned_short>::get
                     ((DirectWireValue<unsigned_short> *)((long)&this->content + 6));
      f_8.exception._6_2_ =
           kj::_::DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                      (unsigned_short *)((long)&f_8.exception + 4));
      f_8.exception._0_4_ = 0;
      kj::_::DebugExpression<unsigned_short>::operator>
                ((DebugComparison<unsigned_short,_unsigned_int> *)local_1f0,
                 (DebugExpression<unsigned_short> *)((long)&f_8.exception + 6),(uint *)&f_8);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
      if (bVar1) goto switchD_00366030_default;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                ((Fault *)&pointerCount,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                 "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                 ,(DebugComparison<unsigned_short,_unsigned_int> *)local_1f0,
                 (char (*) [79])
                 "Schema mismatch: Expected a pointer list, but got a list of data-only structs.");
      kj::_::Debug::Fault::~Fault((Fault *)&pointerCount);
      break;
    case INLINE_COMPOSITE:
      goto switchD_00366030_default;
    }
LAB_00365aee:
    if ((pWStack_38 == (WirePointer *)0x0) || (bVar1 = WirePointer::isNull(pWStack_38), bVar1)) {
      ListReader::ListReader(__return_storage_ptr__,expectedElementSize);
      return __return_storage_ptr__;
    }
    capTable_local = (CapTableReader *)0x0;
    refTarget_local = (word *)pWStack_38;
    defaultValue_local = WirePointer::target(pWStack_38,(SegmentReader *)0x0);
    pWStack_38 = (WirePointer *)0x0;
  } while( true );
}

Assistant:

static KJ_ALWAYS_INLINE(ListReader readListPointer(
      SegmentReader* segment, CapTableReader* capTable,
      const WirePointer* ref, const word* refTarget,
      const word* defaultValue, ElementSize expectedElementSize, int nestingLimit,
      bool checkElementSize = true)) {
    if (ref->isNull()) {
    useDefault:
      if (defaultValue == nullptr ||
          reinterpret_cast<const WirePointer*>(defaultValue)->isNull()) {
        return ListReader(expectedElementSize);
      }
      segment = nullptr;
      ref = reinterpret_cast<const WirePointer*>(defaultValue);
      refTarget = ref->target(segment);
      defaultValue = nullptr;  // If the default value is itself invalid, don't use it again.
    }

    KJ_REQUIRE(nestingLimit > 0,
               "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
      goto useDefault;
    }

    const word* ptr;
    KJ_IF_SOME(p, followFars(ref, refTarget, segment)) {
      ptr = &p;
    } else {
      goto useDefault;
    }

    KJ_REQUIRE(ref->kind() == WirePointer::LIST,
               "Schema mismatch: Message contains non-list pointer where list pointer was "
               "expected.") {
      goto useDefault;
    }

    ElementSize elementSize = ref->listRef.elementSize();
    if (elementSize == ElementSize::INLINE_COMPOSITE) {
      auto wordCount = ref->listRef.inlineCompositeWordCount();

      // An INLINE_COMPOSITE list points to a tag, which is formatted like a pointer.
      const WirePointer* tag = reinterpret_cast<const WirePointer*>(ptr);

      KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                 "Message contains out-of-bounds list pointer. "
                 OUT_OF_BOUNDS_ERROR_DETAIL) {
        goto useDefault;
      }

      ptr += POINTER_SIZE_IN_WORDS;

      KJ_REQUIRE(tag->kind() == WirePointer::STRUCT,
                 "INLINE_COMPOSITE lists of non-STRUCT type are not supported.") {
        goto useDefault;
      }

      auto size = tag->inlineCompositeListElementCount();
      auto wordsPerElement = tag->structRef.wordSize() / ELEMENTS;

      KJ_REQUIRE(upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount,
                 "INLINE_COMPOSITE list's elements overrun its word count.") {
        goto useDefault;
      }

      if (wordsPerElement * (ONE * ELEMENTS) == ZERO * WORDS) {
        // Watch out for lists of zero-sized structs, which can claim to be arbitrarily large
        // without having sent actual data.
        KJ_REQUIRE(amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS)),
                   "Message contains amplified list pointer.") {
          goto useDefault;
        }
      }

      if (checkElementSize) {
        // If a struct list was not expected, then presumably a non-struct list was upgraded to a
        // struct list. We need to manipulate the pointer to point at the first field of the
        // struct. Together with the `step` field, this will allow the struct list to be accessed
        // as if it were a primitive list without branching.

        // Check whether the size is compatible.
        switch (expectedElementSize) {
          case ElementSize::VOID:
            break;

          case ElementSize::BIT:
            KJ_FAIL_REQUIRE(
                "Found struct list where bit list was expected; upgrading boolean lists to structs "
                "is no longer supported.") {
              goto useDefault;
            }
            break;

          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES:
            KJ_REQUIRE(tag->structRef.dataSize.get() > ZERO * WORDS,
                       "Schema mismatch: Expected a primitive list, but got a list of pointer-only "
                       "structs.") {
              goto useDefault;
            }
            break;

          case ElementSize::POINTER:
            KJ_REQUIRE(tag->structRef.ptrCount.get() > ZERO * POINTERS,
                       "Schema mismatch: Expected a pointer list, but got a list of data-only "
                       "structs.") {
              goto useDefault;
            }
            break;

          case ElementSize::INLINE_COMPOSITE:
            break;
        }
      }

      return ListReader(
          segment, capTable, ptr, size, wordsPerElement * BITS_PER_WORD,
          tag->structRef.dataSize.get() * BITS_PER_WORD,
          tag->structRef.ptrCount.get(), ElementSize::INLINE_COMPOSITE,
          nestingLimit - 1);

    } else {
      // This is a primitive or pointer list, but all such lists can also be interpreted as struct
      // lists.  We need to compute the data size and pointer count for such structs.
      auto dataSize = dataBitsPerElement(ref->listRef.elementSize()) * ELEMENTS;
      auto pointerCount = pointersPerElement(ref->listRef.elementSize()) * ELEMENTS;
      auto elementCount = ref->listRef.elementCount();
      auto step = (dataSize + pointerCount * BITS_PER_POINTER) / ELEMENTS;

      auto wordCount = roundBitsUpToWords(upgradeBound<uint64_t>(elementCount) * step);
      KJ_REQUIRE(boundsCheck(segment, ptr, wordCount),
            "Message contains out-of-bounds list pointer. "
            OUT_OF_BOUNDS_ERROR_DETAIL) {
        goto useDefault;
      }

      if (elementSize == ElementSize::VOID) {
        // Watch out for lists of void, which can claim to be arbitrarily large without having sent
        // actual data.
        KJ_REQUIRE(amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS)),
                   "Message contains amplified list pointer.") {
          goto useDefault;
        }
      }

      if (checkElementSize) {
        if (elementSize == ElementSize::BIT && expectedElementSize != ElementSize::BIT) {
          KJ_FAIL_REQUIRE(
              "Found bit list where struct list was expected; upgrading boolean lists to structs "
              "is no longer supported.") {
            goto useDefault;
          }
        }

        // Verify that the elements are at least as large as the expected type.  Note that if we
        // expected INLINE_COMPOSITE, the expected sizes here will be zero, because bounds checking
        // will be performed at field access time.  So this check here is for the case where we
        // expected a list of some primitive or pointer type.

        BitCount expectedDataBitsPerElement =
            dataBitsPerElement(expectedElementSize) * ELEMENTS;
        WirePointerCount expectedPointersPerElement =
            pointersPerElement(expectedElementSize) * ELEMENTS;

        KJ_REQUIRE(expectedDataBitsPerElement <= dataSize,
                   "Schema mismatch: Message contained list with incompatible element type.") {
          goto useDefault;
        }
        KJ_REQUIRE(expectedPointersPerElement <= pointerCount,
                   "Schema mismatch: Message contained list with incompatible element type.") {
          goto useDefault;
        }
      }

      return ListReader(segment, capTable, ptr, elementCount, step,
                        dataSize, pointerCount, elementSize, nestingLimit - 1);
    }
  }